

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O2

bool rapidjson::Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
     Transcode<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
               StackStream<char> *os)

{
  MemoryStream *pMVar1;
  Ch *pCVar2;
  Ch c;
  
  pMVar1 = is->is_;
  pCVar2 = pMVar1->src_;
  if (pCVar2 == pMVar1->end_) {
    c = '\0';
  }
  else {
    pMVar1->src_ = pCVar2 + 1;
    c = *pCVar2;
  }
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  StackStream<char>::Put(os,c);
  return true;
}

Assistant:

static RAPIDJSON_FORCEINLINE bool Transcode(InputStream& is, OutputStream& os) {
        os.Put(is.Take());  // Just copy one code unit. This semantic is different from primary template class.
        return true;
    }